

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_backend_test.cpp
# Opt level: O3

void test_two_clients(intrusive_ptr<cppcms::impl::base_cache> *c1,
                     intrusive_ptr<cppcms::impl::base_cache> *c2)

{
  base_cache *pbVar1;
  char cVar2;
  int iVar3;
  time_t tVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  string tmp;
  ostringstream oss;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [360];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar1 = c1->p_;
  local_1d8[0] = local_1c8;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"test","");
  tVar4 = time((time_t *)0x0);
  (**(code **)(*(long *)pbVar1 + 8))(pbVar1,local_1d8,local_218,&local_60,tVar4 + 1,0);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  pbVar1 = c2->p_;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
  cVar2 = (*(code *)**(undefined8 **)pbVar1)(pbVar1,local_1d8,&local_1f8,0,0,0);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  if (cVar2 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,99);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," c2->fetch(\"foo\",tmp,0)",0x17);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_218);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
  if (iVar3 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," tmp==\"test\"",0xc);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_218);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar1 = c2->p_;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"test2","");
  tVar4 = time((time_t *)0x0);
  (**(code **)(*(long *)pbVar1 + 8))(pbVar1,local_1d8,local_218,&local_60,tVar4 + 1,0);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  pbVar1 = c1->p_;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
  cVar2 = (*(code *)**(undefined8 **)pbVar1)(pbVar1,local_1d8,&local_1f8,0,0,0);
  if (cVar2 == '\0') {
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0]);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
    if (local_1d8[0] != local_1c8) {
      operator_delete(local_1d8[0]);
    }
    if (iVar3 == 0) {
      pbVar1 = c2->p_;
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
      (**(code **)(*(long *)pbVar1 + 0x10))(pbVar1,local_1d8);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0]);
      }
      pbVar1 = c1->p_;
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
      cVar2 = (*(code *)**(undefined8 **)pbVar1)(pbVar1,local_1d8,&local_1f8,0,0,0);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0]);
      }
      if (cVar2 == '\0') {
        pbVar1 = c2->p_;
        local_1d8[0] = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
        local_218[0] = local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"test3","");
        tVar4 = time((time_t *)0x0);
        (**(code **)(*(long *)pbVar1 + 8))(pbVar1,local_1d8,local_218,&local_60,tVar4 + 1,0);
        if (local_218[0] != local_208) {
          operator_delete(local_218[0]);
        }
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0]);
        }
        pbVar1 = c1->p_;
        local_1d8[0] = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
        cVar2 = (*(code *)**(undefined8 **)pbVar1)(pbVar1,local_1d8,&local_1f8,0,0,0);
        if (cVar2 == '\0') {
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0]);
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0]);
          }
          if (iVar3 == 0) {
            (**(code **)(*(long *)c2->p_ + 0x20))();
            pbVar1 = c1->p_;
            local_1d8[0] = local_1c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"foo","");
            cVar2 = (*(code *)**(undefined8 **)pbVar1)(pbVar1,local_1d8,&local_1f8,0,0,0);
            if (local_1d8[0] != local_1c8) {
              operator_delete(local_1d8[0]);
            }
            if (cVar2 == '\0') {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&local_60);
              if (local_1f8 != local_1e8) {
                operator_delete(local_1f8);
              }
              return;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                       ,0x65);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5," c1->fetch(\"foo\",tmp,0)==false",0x1e);
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar6,(string *)local_218);
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                   ,0x65);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," c1->fetch(\"foo\",tmp,0) && tmp==\"test3\"",0x27);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)local_218);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                 ,0x65);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x68);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," c1->fetch(\"foo\",tmp,0)==false",0x1e);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)local_218);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
             ,0x65);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1d8,0x66);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5," c1->fetch(\"foo\",tmp,0) && tmp==\"test2\"",0x27);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)local_218);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_two_clients(booster::intrusive_ptr<cppcms::impl::base_cache> c1,booster::intrusive_ptr<cppcms::impl::base_cache> c2)
{
	std::string tmp;
	std::set<std::string> tags;
	c1->store("foo","test",tags,time(0)+1);
	TEST(c2->fetch("foo",tmp,0));
	TEST(tmp=="test");
	c2->store("foo","test2",tags,time(0)+1);
	TEST(c1->fetch("foo",tmp,0) && tmp=="test2");
	c2->rise("foo");
	TEST(c1->fetch("foo",tmp,0)==false);
	c2->store("foo","test3",tags,time(0)+1);
	TEST(c1->fetch("foo",tmp,0) && tmp=="test3");
	c2->clear();
	TEST(c1->fetch("foo",tmp,0)==false);
}